

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

bool S_CheckSoundLimit(sfxinfo_t *sfx,FVector3 *pos,int near_limit,float limit_range,AActor *actor,
                      int channel)

{
  int iVar1;
  sfxinfo_t *psVar2;
  double dVar3;
  TVector3<float> local_5c;
  undefined1 local_50 [8];
  FVector3 chanorigin;
  int count;
  FSoundChan *chan;
  int channel_local;
  AActor *actor_local;
  float limit_range_local;
  int near_limit_local;
  FVector3 *pos_local;
  sfxinfo_t *sfx_local;
  
  stack0xffffffffffffffc0 = Channels;
  chanorigin.Y = 0.0;
  do {
    if (stack0xffffffffffffffc0 == (FSoundChan *)0x0 || near_limit <= (int)chanorigin.Y) {
      return near_limit <= (int)chanorigin.Y;
    }
    if ((stack0xffffffffffffffc0->ChanFlags & 2U) == 0) {
      iVar1 = FSoundID::operator_cast_to_int(&stack0xffffffffffffffc0->SoundID);
      psVar2 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(long)iVar1);
      if (psVar2 == sfx) {
        TVector3<float>::TVector3((TVector3<float> *)local_50);
        if ((((actor != (AActor *)0x0) && ((uint)stack0xffffffffffffffc0->EntChannel == channel)) &&
            (stack0xffffffffffffffc0->SourceType == '\x01')) &&
           ((stack0xffffffffffffffc0->field_12).Actor == actor)) {
          return false;
        }
        CalcPosVel(stack0xffffffffffffffc0,(FVector3 *)local_50,(FVector3 *)0x0);
        TVector3<float>::operator-(&local_5c,(TVector3<float> *)local_50);
        dVar3 = TVector3<float>::LengthSquared(&local_5c);
        if (dVar3 <= (double)limit_range) {
          chanorigin.Y = (float)((int)chanorigin.Y + 1);
        }
      }
    }
    unique0x00012000 = stack0xffffffffffffffc0->NextChan;
  } while( true );
}

Assistant:

bool S_CheckSoundLimit(sfxinfo_t *sfx, const FVector3 &pos, int near_limit, float limit_range,
	AActor *actor, int channel)
{
	FSoundChan *chan;
	int count;
	
	for (chan = Channels, count = 0; chan != NULL && count < near_limit; chan = chan->NextChan)
	{
		if (!(chan->ChanFlags & CHAN_EVICTED) && &S_sfx[chan->SoundID] == sfx)
		{
			FVector3 chanorigin;

			if (actor != NULL && chan->EntChannel == channel &&
				chan->SourceType == SOURCE_Actor && chan->Actor == actor)
			{ // We are restarting a playing sound. Always let it play.
				return false;
			}

			CalcPosVel(chan, &chanorigin, NULL);
			if ((chanorigin - pos).LengthSquared() <= limit_range)
			{
				count++;
			}
		}
	}
	return count >= near_limit;
}